

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall
tinyxml2::XMLNode::InsertAfterChild(XMLNode *this,XMLNode *afterThis,XMLNode *addThis)

{
  XMLNode *in_RDX;
  XMLNode *in_RSI;
  XMLNode *in_RDI;
  XMLNode *local_8;
  
  if (in_RDX->_document == in_RDI->_document) {
    if (in_RSI->_parent == in_RDI) {
      if (in_RSI->_next == (XMLNode *)0x0) {
        local_8 = InsertEndChild(in_RSI,in_RDX);
      }
      else {
        InsertChildPreamble(in_RDX,in_RDI);
        in_RDX->_prev = in_RSI;
        in_RDX->_next = in_RSI->_next;
        in_RSI->_next->_prev = in_RDX;
        in_RSI->_next = in_RDX;
        in_RDX->_parent = in_RDI;
        local_8 = in_RDX;
      }
    }
    else {
      local_8 = (XMLNode *)0x0;
    }
  }
  else {
    local_8 = (XMLNode *)0x0;
  }
  return local_8;
}

Assistant:

XMLNode* XMLNode::InsertAfterChild( XMLNode* afterThis, XMLNode* addThis )
{
    TIXMLASSERT( addThis );
    if ( addThis->_document != _document ) {
        TIXMLASSERT( false );
        return 0;
    }

    TIXMLASSERT( afterThis );

    if ( afterThis->_parent != this ) {
        TIXMLASSERT( false );
        return 0;
    }

    if ( afterThis->_next == 0 ) {
        // The last node or the only node.
        return InsertEndChild( addThis );
    }
    InsertChildPreamble( addThis );
    addThis->_prev = afterThis;
    addThis->_next = afterThis->_next;
    afterThis->_next->_prev = addThis;
    afterThis->_next = addThis;
    addThis->_parent = this;
    return addThis;
}